

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcountable.h
# Opt level: O1

void __thiscall
std::
pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::pair(pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,pair<Potassco::ProgramOptions::detail::IntrusiveSharedPtr<Potassco::ProgramOptions::Option>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Option *pOVar3;
  pointer pcVar4;
  undefined8 uVar5;
  
  pOVar3 = (param_2->first).ptr_;
  (this->first).ptr_ = pOVar3;
  if (pOVar3 != (Option *)0x0) {
    (pOVar3->super_RefCountable).refCount_ = (pOVar3->super_RefCountable).refCount_ + 1;
  }
  paVar1 = &(this->second).field_2;
  (this->second)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (param_2->second)._M_dataplus._M_p;
  paVar2 = &(param_2->second).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&(param_2->second).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->second).field_2 + 8) = uVar5;
  }
  else {
    (this->second)._M_dataplus._M_p = pcVar4;
    (this->second).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->second)._M_string_length = (param_2->second)._M_string_length;
  (param_2->second)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->second)._M_string_length = 0;
  (param_2->second).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

IntrusiveSharedPtr(const IntrusiveSharedPtr& o) throw()
		: ptr_(o.ptr_) {
		addRef();
	}